

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::iterator::
updateParentBounds(iterator *this,uint32_t level,interval<unsigned_long> *key)

{
  uint32_t i;
  uint32_t *puVar1;
  BranchNode<unsigned_long,_8U,_true> *this_00;
  BranchNode<unsigned_long,_8U,_false> *this_01;
  int in_ESI;
  interval<unsigned_long> *existing;
  uint32_t offset;
  Path *path;
  interval<unsigned_long> *in_stack_ffffffffffffffc8;
  uint32_t level_00;
  interval<unsigned_long> *in_stack_ffffffffffffffd0;
  undefined4 local_c;
  
  local_c = in_ESI;
  while (level_00 = (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20), local_c != 0) {
    local_c = local_c + -1;
    puVar1 = IntervalMapDetails::Path::offset((Path *)in_stack_ffffffffffffffd0,level_00);
    i = *puVar1;
    if (local_c == 0) {
      this_00 = IntervalMapDetails::Path::
                node<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>>
                          ((Path *)in_stack_ffffffffffffffd0,level_00);
      in_stack_ffffffffffffffc8 =
           IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>::keyAt(this_00,i);
    }
    else {
      this_01 = IntervalMapDetails::Path::
                node<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                          ((Path *)in_stack_ffffffffffffffd0,level_00);
      in_stack_ffffffffffffffc8 =
           IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>::keyAt(this_01,i);
    }
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffc8;
    IntervalMapDetails::interval<unsigned_long>::unionWith
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::updateParentBounds(
    uint32_t level, const IntervalMapDetails::interval<TKey>& key) {
    auto& path = this->path;
    while (level) {
        --level;
        auto offset = path.offset(level);
        auto& existing = level == 0 ? path.template node<RootBranch>(level).keyAt(offset)
                                    : path.template node<Branch>(level).keyAt(offset);
        existing.unionWith(key);
    }
}